

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvlat1.cpp
# Opt level: O3

void ucnv_Latin1FromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                        UErrorCode *pErrorCode)

{
  byte bVar1;
  uint uVar2;
  UConverter *pUVar3;
  byte *pbVar4;
  byte bVar5;
  int32_t iVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  int iVar10;
  
  pUVar3 = pToUArgs->converter;
  pbVar7 = (byte *)pToUArgs->source;
  pbVar9 = (byte *)pToUArgs->sourceLimit;
  pbVar4 = (byte *)pFromUArgs->target;
  iVar10 = *(int *)&pFromUArgs->targetLimit - (int)pbVar4;
  if (('\0' < pUVar3->toULength) && (uVar2 = pUVar3->toUnicodeStatus, pbVar7 < pbVar9 && uVar2 != 0)
     ) {
    if (iVar10 == 0) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      return;
    }
    if (((uVar2 & 0xfffffffe) != 0xc2) || (bVar5 = *pbVar7, -0x41 < (char)bVar5)) {
LAB_0016f4f5:
      *pErrorCode = U_USING_DEFAULT_WARNING;
      return;
    }
    pbVar7 = pbVar7 + 1;
    *pbVar4 = bVar5 | (char)uVar2 << 6;
    pbVar4 = pbVar4 + 1;
    iVar10 = iVar10 + -1;
    pUVar3->toUnicodeStatus = 0;
    pUVar3->toULength = '\0';
  }
  if ((pbVar7 < pbVar9) && ((byte)(pbVar9[-1] + 0x3e) < 0x33)) {
    pbVar9 = pbVar9 + -1;
  }
  do {
    if (pbVar9 <= pbVar7) {
      if ((*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) && (pbVar7 < pToUArgs->sourceLimit)) {
        bVar5 = *pbVar7;
        pUVar3->toUBytes[0] = bVar5;
        pUVar3->toUnicodeStatus = (uint)bVar5;
        pUVar3->toULength = '\x01';
        iVar6 = 1;
        if (((char)bVar5 < '\0') && (iVar6 = 0, (byte)(bVar5 + 0x3e) < 0x33)) {
          iVar6 = ((uint)(0xdf < bVar5) - (uint)(bVar5 < 0xf0)) + 3;
        }
        pbVar7 = pbVar7 + 1;
        pUVar3->mode = iVar6;
      }
LAB_0016f4db:
      pToUArgs->source = (char *)pbVar7;
      pFromUArgs->target = (char *)pbVar4;
      return;
    }
    if (iVar10 < 1) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_0016f4db;
    }
    pbVar8 = pbVar7 + 1;
    bVar5 = *pbVar7;
    if ((char)bVar5 < '\0') {
      if (((bVar5 & 0xfe) != 0xc2) || (bVar1 = *pbVar8, -0x41 < (char)bVar1)) {
        pToUArgs->source = (char *)pbVar7;
        pFromUArgs->target = (char *)pbVar4;
        goto LAB_0016f4f5;
      }
      pbVar8 = pbVar7 + 2;
      bVar5 = bVar5 << 6 | bVar1;
    }
    *pbVar4 = bVar5;
    iVar10 = iVar10 + -1;
    pbVar4 = pbVar4 + 1;
    pbVar7 = pbVar8;
  } while( true );
}

Assistant:

static void U_CALLCONV
ucnv_Latin1FromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                    UConverterToUnicodeArgs *pToUArgs,
                    UErrorCode *pErrorCode) {
    UConverter *utf8;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    UChar32 c;
    uint8_t b, t1;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    /* get the converter state from the UTF-8 UConverter */
    if (utf8->toULength > 0) {
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        c = 0;
    }
    if(c!=0 && source<sourceLimit) {
        if(targetCapacity==0) {
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            return;
        } else if(c>=0xc2 && c<=0xc3 && (t1=(uint8_t)(*source-0x80)) <= 0x3f) {
            ++source;
            *target++=(uint8_t)(((c&3)<<6)|t1);
            --targetCapacity;

            utf8->toUnicodeStatus=0;
            utf8->toULength=0;
        } else {
            /* complicated, illegal or unmappable input: fall back to the pivoting implementation */
            *pErrorCode=U_USING_DEFAULT_WARNING;
            return;
        }
    }

    /*
     * Make sure that the last byte sequence before sourceLimit is complete
     * or runs into a lead byte.
     * In the conversion loop compare source with sourceLimit only once
     * per multi-byte character.
     * For Latin-1, adjust sourceLimit only for 1 trail byte because
     * the conversion loop handles at most 2-byte sequences.
     */
    if(source<sourceLimit && U8_IS_LEAD(*(sourceLimit-1))) {
        --sourceLimit;
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                *target++=(uint8_t)b;
                --targetCapacity;
            } else if( /* handle U+0080..U+00FF inline */
                       b>=0xc2 && b<=0xc3 &&
                       (t1=(uint8_t)(*source-0x80)) <= 0x3f
            ) {
                ++source;
                *target++=(uint8_t)(((b&3)<<6)|t1);
                --targetCapacity;
            } else {
                /* complicated, illegal or unmappable input: fall back to the pivoting implementation */
                pToUArgs->source=(char *)(source-1);
                pFromUArgs->target=(char *)target;
                *pErrorCode=U_USING_DEFAULT_WARNING;
                return;
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     * For Latin-1, there is at most exactly one lead byte because of the
     * smaller sourceLimit adjustment logic.
     */
    if(U_SUCCESS(*pErrorCode) && source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        utf8->toUnicodeStatus=utf8->toUBytes[0]=b=*source++;
        utf8->toULength=1;
        utf8->mode=U8_COUNT_BYTES(b);
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}